

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# long_branch_link.c
# Opt level: O0

void long_branch_link(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  ushort *in_RSI;
  long in_RDI;
  uint32_t full_address;
  uint32_t oldpc;
  uint32_t oldlr;
  uint32_t offset;
  long_branch_link_t *instr;
  uint32_t value_1;
  uint32_t value;
  int in_stack_fffffffffffffe98;
  uint32_t in_stack_fffffffffffffe9c;
  arm7tdmi_t *in_stack_fffffffffffffea0;
  int local_6c;
  
  uVar1 = *in_RSI;
  if ((*in_RSI >> 0xb & 1) == 0) {
    uVar3 = sign_extend_word((uint32_t)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                             in_stack_fffffffffffffe98);
    uVar2 = *(int *)(in_RDI + 0xb0) + uVar3 * 0x1000;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",0xe,(ulong)uVar2);
    }
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      *(uint *)(in_RDI + 0x9c) = uVar2;
      break;
    case 0x12:
      *(uint *)(in_RDI + 0xa8) = uVar2;
      break;
    case 0x13:
      *(uint *)(in_RDI + 0xa0) = uVar2;
      break;
    default:
      *(uint *)(in_RDI + 0x98) = uVar2;
      break;
    case 0x17:
      *(uint *)(in_RDI + 0xa4) = uVar2;
      break;
    case 0x1b:
      *(uint *)(in_RDI + 0xac) = uVar2;
    }
  }
  else {
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_6c = *(int *)(in_RDI + 0x9c);
      break;
    case 0x12:
      local_6c = *(int *)(in_RDI + 0xa8);
      break;
    case 0x13:
      local_6c = *(int *)(in_RDI + 0xa0);
      break;
    default:
      local_6c = *(int *)(in_RDI + 0x98);
      break;
    case 0x17:
      local_6c = *(int *)(in_RDI + 0xa4);
      break;
    case 0x1b:
      local_6c = *(int *)(in_RDI + 0xac);
    }
    uVar2 = *(int *)(in_RDI + 0xb0) - 2U | 1;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",0xe,(ulong)uVar2);
    }
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      *(uint *)(in_RDI + 0x9c) = uVar2;
      break;
    case 0x12:
      *(uint *)(in_RDI + 0xa8) = uVar2;
      break;
    case 0x13:
      *(uint *)(in_RDI + 0xa0) = uVar2;
      break;
    default:
      *(uint *)(in_RDI + 0x98) = uVar2;
      break;
    case 0x17:
      *(uint *)(in_RDI + 0xa4) = uVar2;
      break;
    case 0x1b:
      *(uint *)(in_RDI + 0xac) = uVar2;
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",0xf,(ulong)(local_6c + (uint)(uVar1 & 0x7ff) * 2 + 1));
    }
    if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
      set_pc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    }
    else {
      set_pc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    }
  }
  return;
}

Assistant:

void long_branch_link(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    long_branch_link_t* instr = &thminstr->LONG_BRANCH_LINK;
    word offset = instr->offset;

    if (instr->h) {
        offset <<= 1;
        word oldlr = get_register(state, REG_LR);
        word oldpc = get_register(state, REG_PC);
        word full_address = oldlr + offset + 1;
        set_register(state, REG_LR, (oldpc - 2) | 1);
        set_register(state, REG_PC, full_address);
    } else {
        offset = sign_extend_word(offset, 11, 32);
        offset <<= 12;
        set_register(state, REG_LR, state->pc + offset);
    }

}